

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char *value)

{
  format_error *this;
  buffer_appender<char> bVar1;
  size_t in_RCX;
  basic_string_view<char> value_00;
  basic_string_view<char> local_58;
  detail *local_48;
  size_t local_38;
  size_t length;
  char *local_20;
  char *value_local;
  buffer_appender<char> out_local;
  
  local_20 = value;
  value_local = (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if (value == (char *)0x0) {
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"string pointer is null");
    __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
  }
  local_38 = std::char_traits<char>::length((char_type *)0x4f9600);
  local_48 = (detail *)value_local;
  basic_string_view<char>::basic_string_view(&local_58,local_20,local_38);
  value_00.size_ = in_RCX;
  value_00.data_ = (char *)local_58.size_;
  bVar1 = write<char>(local_48,(buffer_appender<char>)local_58.data_,value_00);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}